

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

int create_and_put_SAS_token_to_cbs(AUTHENTICATION_INSTANCE_conflict *instance)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  IOTHUB_CREDENTIAL_TYPE IVar1;
  char *pcVar2;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  char *pcVar5;
  ASYNC_OPERATION_HANDLE pAVar6;
  time_t tVar7;
  int iVar8;
  int iVar9;
  
  pcVar4 = instance->device_id;
  pcVar5 = instance->module_id;
  pcVar2 = STRING_c_str(instance->iothub_host_fqdn);
  if (pcVar5 == (char *)0x0) {
    handle_00 = STRING_construct_sprintf("%s/devices/%s",pcVar2,pcVar4);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133c62;
      iVar8 = 0x98;
LAB_00133c55:
      handle_00 = (STRING_HANDLE)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"create_device_and_module_path",iVar8,1,
                "Failed creating devices_and_modules_path (STRING_new failed)");
    }
  }
  else {
    handle_00 = STRING_construct_sprintf("%s/devices/%s/modules/%s",pcVar2,pcVar4,pcVar5);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        iVar8 = 0x9f;
        goto LAB_00133c55;
      }
LAB_00133c62:
      handle_00 = (STRING_HANDLE)0x0;
    }
  }
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xf8;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
              ,"create_and_put_SAS_token_to_cbs",0xfa,1,
              "Failed creating a SAS token (create_device_and_module_path() failed)");
    return 0xf8;
  }
  IVar1 = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
  if ((IVar1 & ~IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
    handle = instance->authorization_module;
    pcVar4 = STRING_c_str(handle_00);
    pcVar5 = IoTHubClient_Auth_Get_SasToken(handle,pcVar4,0,(char *)0x0);
    if (pcVar5 != (char *)0x0) {
LAB_00133d41:
      iVar8 = 0;
      goto LAB_00133dcf;
    }
    p_Var3 = xlogging_get_log_function();
    iVar8 = 0x105;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133dcc;
    pcVar4 = "failure getting sas token.";
    iVar9 = 0x104;
  }
  else if (IVar1 == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) {
    pcVar5 = IoTHubClient_Auth_Get_SasToken
                       (instance->authorization_module,(char *)0x0,0,(char *)0x0);
    if (pcVar5 != (char *)0x0) goto LAB_00133d41;
    p_Var3 = xlogging_get_log_function();
    iVar8 = 0x112;
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_00133dcc:
      pcVar5 = (char *)0x0;
      goto LAB_00133dcf;
    }
    pcVar4 = "Failure getting SAS token.";
    iVar9 = 0x111;
  }
  else {
    if ((IVar1 & ~IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) == IOTHUB_CREDENTIAL_TYPE_X509) {
      pcVar5 = (char *)0x0;
      iVar8 = 0;
      goto LAB_00133dcf;
    }
    p_Var3 = xlogging_get_log_function();
    iVar8 = 0x122;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00133dcc;
    pcVar4 = "failure unknown credential type found.";
    iVar9 = 0x120;
  }
  pcVar5 = (char *)0x0;
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"create_and_put_SAS_token_to_cbs",iVar9,1,pcVar4);
LAB_00133dcf:
  if (pcVar5 != (char *)0x0) {
    instance->is_cbs_put_token_in_progress = true;
    pcVar4 = STRING_c_str(handle_00);
    pAVar6 = cbs_put_token_async(instance->cbs_handle,"servicebus.windows.net:sastoken",pcVar4,
                                 pcVar5,on_cbs_put_token_complete_callback,instance);
    instance->cbs_put_token_async_context = pAVar6;
    if (pAVar6 == (ASYNC_OPERATION_HANDLE)0x0) {
      instance->is_cbs_put_token_in_progress = false;
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                  ,"put_SAS_token_to_cbs",0xdc,1,
                  "Failed putting SAS token to CBS for device \'%s\' (cbs_put_token failed)",
                  instance->device_id);
      }
    }
    else {
      tVar7 = get_time((time_t *)0x0);
      if ((tVar7 == -1) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                  ,"put_SAS_token_to_cbs",0xe4,1,
                  "Failed setting current_sas_token_put_time for device \'%s\' (get_time() failed)",
                  instance->device_id);
      }
      instance->current_sas_token_put_time = tVar7;
    }
    iVar8 = 0;
    if (pAVar6 == (ASYNC_OPERATION_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      iVar8 = 0x12a;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                  ,"create_and_put_SAS_token_to_cbs",299,1,"Failed putting SAS token to CBS");
      }
    }
    free(pcVar5);
  }
  STRING_delete(handle_00);
  return iVar8;
}

Assistant:

static int create_and_put_SAS_token_to_cbs(AUTHENTICATION_INSTANCE* instance)
{
    int result;
    char* sas_token;
    STRING_HANDLE device_and_module_path;

    if ((device_and_module_path = create_device_and_module_path(instance->iothub_host_fqdn, instance->device_id, instance->module_id)) == NULL)
    {
        result = MU_FAILURE;
        sas_token = NULL;
        LogError("Failed creating a SAS token (create_device_and_module_path() failed)");
    }
    else
    {
        IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
        if (cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY || cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
        {
            sas_token = IoTHubClient_Auth_Get_SasToken(instance->authorization_module, STRING_c_str(device_and_module_path), 0, NULL);
            if (sas_token == NULL)
            {
                LogError("failure getting sas token.");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if (cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            sas_token = IoTHubClient_Auth_Get_SasToken(instance->authorization_module, NULL, 0, NULL);
            if (sas_token == NULL)
            {
                LogError("Failure getting SAS token.");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if (cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC)
        {
            sas_token = NULL;
            result = RESULT_OK;
        }
        else
        {
            LogError("failure unknown credential type found.");
            sas_token = NULL;
            result = MU_FAILURE;
        }


        if (sas_token != NULL)
        {
            if (put_SAS_token_to_cbs(instance, device_and_module_path, sas_token) != RESULT_OK)
            {
                result = MU_FAILURE;
                LogError("Failed putting SAS token to CBS");
            }
            else
            {
                result = RESULT_OK;
            }
            free(sas_token);
        }

        STRING_delete(device_and_module_path);
    }
    return result;
}